

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

int Llb_ManCutLiNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  
  if ((long)vMinCut->nSize < 1) {
    iVar3 = 0;
  }
  else {
    uVar7 = 0xffffffff;
    lVar6 = 0;
    iVar3 = 0;
    do {
      uVar1 = *(ulong *)((long)vMinCut->pArray[lVar6] + 0x18);
      uVar5 = (uint)uVar1;
      if ((uVar5 & 7) != 2) {
        if (p->pFanData == (int *)0x0) {
          __assert_fail("p->pFanData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                        ,0x11a,"int Llb_ManCutLiNum(Aig_Man_t *, Vec_Ptr_t *)");
        }
        if (0x3f < uVar5) {
          uVar1 = uVar1 >> 6;
          iVar4 = 0;
          do {
            if (iVar4 == 0) {
              iVar8 = *(int *)((long)vMinCut->pArray[lVar6] + 0x24);
              if (p->nFansAlloc <= iVar8) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar8 = iVar8 * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar7 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar8 = (uVar7 & 1) + ((int)uVar7 >> 1) * 5 + 3;
            }
            uVar7 = p->pFanData[iVar8];
            pVVar2 = p->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar9 = (int *)0x0;
            }
            else {
              uVar5 = (int)uVar7 >> 1;
              if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              piVar9 = (int *)pVVar2->pArray[uVar5];
            }
            if (((piVar9[6] & 7U) == 3) && (p->nTruePos <= *piVar9)) {
              iVar3 = iVar3 + 1;
              break;
            }
            iVar4 = iVar4 + 1;
          } while (((uint)uVar1 & 0x3ffffff) + (uint)((uVar1 & 0x3ffffff) == 0) != iVar4);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != vMinCut->nSize);
  }
  return iVar3;
}

Assistant:

int Llb_ManCutLiNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pFanout;
    Aig_Obj_t * pObj;
    int i, k, iFanout = -1, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
            continue;
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, k )
        {
            if ( Saig_ObjIsLi(p, pFanout) )
            {
                Counter++;
                break;
            }
        }
    }
    return Counter;
}